

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall
CVmObjTads::getp_create_multi_common
          (CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,int is_transient)

{
  int iVar1;
  vm_obj_id_t obj;
  undefined4 *in_RCX;
  vm_val_t *in_RDX;
  uint argc;
  int in_stack_00000080;
  uint in_stack_00000084;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if (in_RCX == (undefined4 *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *in_RCX;
  }
  if ((getp_create_multi_common(unsigned_int,vm_val_t*,unsigned_int*,int)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_create_multi_common(unsigned_int,vm_val_t*,unsigned_int*,int)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_create_multi_common::desc,0,0,1);
    __cxa_guard_release(&getp_create_multi_common(unsigned_int,vm_val_t*,unsigned_int*,int)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),
                     in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    obj = create_from_stack_multi(in_stack_00000084,in_stack_00000080);
    vm_val_t::set_obj(in_RDX,obj);
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_create_multi_common(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *in_argc,
                                         int is_transient)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 0, TRUE);

    /* check arguments - any number are allowed */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* create the new instance */
    retval->set_obj(create_from_stack_multi(vmg_ argc, is_transient));

    /* handled */
    return TRUE;
}